

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep.cc
# Opt level: O1

bool __thiscall DyndepLoader::UpdateEdge(DyndepLoader *this,Edge *edge,Dyndeps *dyndeps,string *err)

{
  BindingEnv *this_00;
  Edge *pEVar1;
  pointer ppNVar2;
  pointer ppNVar3;
  const_iterator i;
  bool bVar4;
  string local_70;
  string local_50;
  
  if (dyndeps->restat_ == true) {
    this_00 = edge->env_;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"restat","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"1","");
    BindingEnv::AddBinding(this_00,&local_70,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<Node*,std::allocator<Node*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>>
            ((vector<Node*,std::allocator<Node*>> *)&edge->outputs_,
             (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (dyndeps->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (dyndeps->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  ppNVar3 = (dyndeps->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  edge->implicit_outs_ =
       edge->implicit_outs_ +
       (int)((ulong)((long)(dyndeps->implicit_outputs_).
                           super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)ppNVar3) >> 3);
  do {
    bVar4 = ppNVar3 ==
            (dyndeps->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
    if (bVar4) {
LAB_0010ef0e:
      std::vector<Node*,std::allocator<Node*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>>
                ((vector<Node*,std::allocator<Node*>> *)&edge->inputs_,
                 (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + -(long)edge->order_only_deps_,
                 (dyndeps->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (dyndeps->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      ppNVar3 = (dyndeps->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      edge->implicit_deps_ =
           edge->implicit_deps_ +
           (int)((ulong)((long)(dyndeps->implicit_inputs_).
                               super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)ppNVar3) >> 3);
      for (; ppNVar3 !=
             (dyndeps->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
             .super__Vector_impl_data._M_finish; ppNVar3 = ppNVar3 + 1) {
        Node::AddOutEdge(*ppNVar3,edge);
      }
      return bVar4;
    }
    pEVar1 = (*ppNVar3)->in_edge_;
    if (pEVar1 != (Edge *)0x0) {
      if (pEVar1->generated_by_dep_loader_ == false) {
        std::operator+(&local_70,"multiple rules generate ",&(*ppNVar3)->path_);
        std::__cxx11::string::operator=((string *)err,(string *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (!bVar4) {
          return bVar4;
        }
        goto LAB_0010ef0e;
      }
      ppNVar2 = (pEVar1->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((pEVar1->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppNVar2) {
        (pEVar1->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppNVar2;
      }
    }
    (*ppNVar3)->in_edge_ = edge;
    ppNVar3 = ppNVar3 + 1;
  } while( true );
}

Assistant:

bool DyndepLoader::UpdateEdge(Edge* edge, Dyndeps const* dyndeps,
                              std::string* err) const {
  // Add dyndep-discovered bindings to the edge.
  // We know the edge already has its own binding
  // scope because it has a "dyndep" binding.
  if (dyndeps->restat_)
    edge->env_->AddBinding("restat", "1");

  // Add the dyndep-discovered outputs to the edge.
  edge->outputs_.insert(edge->outputs_.end(),
                        dyndeps->implicit_outputs_.begin(),
                        dyndeps->implicit_outputs_.end());
  edge->implicit_outs_ += dyndeps->implicit_outputs_.size();

  // Add this edge as incoming to each new output.
  for (std::vector<Node*>::const_iterator i =
           dyndeps->implicit_outputs_.begin();
       i != dyndeps->implicit_outputs_.end(); ++i) {
    if (Edge* old_in_edge = (*i)->in_edge()) {
      // This node already has an edge producing it.  Fail with an error
      // unless the edge was generated by ImplicitDepLoader, in which
      // case we can replace it with the now-known real producer.
      if (!old_in_edge->generated_by_dep_loader_) {
        *err = "multiple rules generate " + (*i)->path();
        return false;
      }
      old_in_edge->outputs_.clear();
    }
    (*i)->set_in_edge(edge);
  }

  // Add the dyndep-discovered inputs to the edge.
  edge->inputs_.insert(edge->inputs_.end() - edge->order_only_deps_,
                       dyndeps->implicit_inputs_.begin(),
                       dyndeps->implicit_inputs_.end());
  edge->implicit_deps_ += dyndeps->implicit_inputs_.size();

  // Add this edge as outgoing from each new input.
  for (std::vector<Node*>::const_iterator i =
           dyndeps->implicit_inputs_.begin();
       i != dyndeps->implicit_inputs_.end(); ++i)
    (*i)->AddOutEdge(edge);

  return true;
}